

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O1

uint llvm::dwarf::AttributeVendor(Attribute Attribute)

{
  uint uVar1;
  int iVar2;
  undefined6 in_register_0000003a;
  
  uVar1 = 0;
  iVar2 = (int)CONCAT62(in_register_0000003a,Attribute);
  if (iVar2 < 0x3b11) {
    uVar1 = 0;
    switch(iVar2) {
    case 0x2101:
    case 0x2102:
    case 0x2103:
    case 0x2104:
    case 0x2105:
    case 0x2106:
    case 0x2107:
    case 0x210f:
    case 0x2110:
    case 0x2111:
    case 0x2112:
    case 0x2113:
    case 0x2114:
    case 0x2115:
    case 0x2116:
    case 0x2117:
    case 0x2118:
    case 0x2119:
    case 0x2130:
    case 0x2131:
    case 0x2132:
    case 0x2133:
    case 0x2134:
    case 0x2135:
    case 0x2136:
      uVar1 = 3;
      break;
    case 0x2108:
    case 0x2109:
    case 0x210a:
    case 0x210b:
    case 0x210c:
    case 0x210d:
    case 0x210e:
    case 0x211a:
    case 0x211b:
    case 0x211c:
    case 0x211d:
    case 0x211e:
    case 0x211f:
    case 0x2120:
    case 0x2121:
    case 0x2122:
    case 0x2123:
    case 0x2124:
    case 0x2125:
    case 0x2126:
    case 0x2127:
    case 0x2128:
    case 0x2129:
    case 0x212a:
    case 0x212b:
    case 0x212c:
    case 0x212d:
    case 0x212e:
    case 0x212f:
      break;
    default:
      uVar1 = 0;
      switch(iVar2) {
      case 0x2002:
      case 0x2003:
      case 0x2004:
      case 0x2005:
      case 0x2006:
      case 0x2007:
      case 0x2008:
      case 0x2009:
      case 0x200a:
      case 0x200b:
      case 0x200c:
      case 0x200d:
      case 0x200e:
      case 0x200f:
      case 0x2010:
      case 0x2011:
        uVar1 = 6;
      }
    }
  }
  else {
    switch(iVar2) {
    case 0x3b11:
    case 0x3b12:
    case 0x3b13:
    case 0x3b14:
    case 0x3b15:
    case 0x3b20:
    case 0x3b21:
    case 0x3b22:
    case 0x3b23:
    case 0x3b24:
    case 0x3b25:
    case 0x3b26:
    case 0x3b27:
    case 0x3b28:
    case 0x3b29:
    case 0x3b30:
    case 0x3b31:
      uVar1 = 2;
      break;
    case 0x3b16:
    case 0x3b17:
    case 0x3b18:
    case 0x3b19:
    case 0x3b1a:
    case 0x3b1b:
    case 0x3b1c:
    case 0x3b1d:
    case 0x3b1e:
    case 0x3b1f:
    case 0x3b2a:
    case 0x3b2b:
    case 0x3b2c:
    case 0x3b2d:
    case 0x3b2e:
    case 0x3b2f:
      break;
    default:
      switch(iVar2) {
      case 0x3fe1:
      case 0x3fe2:
      case 0x3fe3:
      case 0x3fe4:
      case 0x3fe5:
      case 0x3fe6:
      case 0x3fe7:
      case 0x3fe8:
      case 0x3fe9:
      case 0x3fea:
      case 0x3feb:
      case 0x3fec:
      case 0x3fed:
        uVar1 = 1;
        break;
      default:
        switch(iVar2) {
        case 0x3e00:
        case 0x3e01:
        case 0x3e02:
        case 0x3e03:
          uVar1 = 5;
        }
      }
    }
  }
  return uVar1;
}

Assistant:

unsigned llvm::dwarf::AttributeVendor(dwarf::Attribute Attribute) {
  switch (Attribute) {
  default:
    return 0;
#define HANDLE_DW_AT(ID, NAME, VERSION, VENDOR)                                \
  case DW_AT_##NAME:                                                           \
    return DWARF_VENDOR_##VENDOR;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}